

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpClient.cpp
# Opt level: O3

void xmrig::ClientWriteBaton::onWrite(uv_write_t *req,int param_2)

{
  void *pvVar1;
  
  pvVar1 = req->data;
  if (pvVar1 != (void *)0x0) {
    if (*(void **)((long)pvVar1 + 0x100) != (void *)((long)pvVar1 + 0x110)) {
      operator_delete(*(void **)((long)pvVar1 + 0x100));
    }
    if (*(void **)((long)pvVar1 + 0xe0) != (void *)((long)pvVar1 + 0xf0)) {
      operator_delete(*(void **)((long)pvVar1 + 0xe0));
    }
  }
  operator_delete(pvVar1);
  return;
}

Assistant:

inline static void onWrite(uv_write_t *req, int) { delete reinterpret_cast<ClientWriteBaton *>(req->data); }